

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O1

SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> __thiscall
deqp::egl::GLES2ThreadTest::GLES2ResourceManager::popBuffer(GLES2ResourceManager *this,int index)

{
  int *piVar1;
  long lVar2;
  pointer pSVar3;
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>_>_>
  *this_00;
  int in_EDX;
  SharedPtrStateBase *extraout_RDX;
  undefined4 in_register_00000034;
  long lVar4;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> SVar5;
  
  lVar2 = *(long *)(CONCAT44(in_register_00000034,index) + 0x18);
  this_00 = (vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>_>_>
             *)(CONCAT44(in_register_00000034,index) + 0x18);
  lVar4 = (long)in_EDX * 0x10;
  (this->m_textures).
  super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
  ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(lVar2 + lVar4);
  pSVar3 = *(pointer *)(lVar2 + 8 + lVar4);
  (this->m_textures).
  super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar3;
  if (pSVar3 != (pointer)0x0) {
    LOCK();
    *(int *)&pSVar3->m_state = *(int *)&pSVar3->m_state + 1;
    UNLOCK();
    LOCK();
    piVar1 = (int *)((long)&((this->m_textures).
                             super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->m_state + 4);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>_>_>
  ::_M_erase(this_00,(this_00->
                     super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + in_EDX);
  SVar5.m_state = extraout_RDX;
  SVar5.m_ptr = (Buffer *)this;
  return SVar5;
}

Assistant:

SharedPtr<Buffer> GLES2ResourceManager::popBuffer (int index)
{
	SharedPtr<Buffer> buffer = m_buffers[index];

	m_buffers.erase(m_buffers.begin() + index);

	return buffer;
}